

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_Mesh::TransposeSurfaceParameters(ON_Mesh *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ON_2dPoint *pOVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  ON_Interval temp;
  
  uVar6 = *(undefined8 *)&this->field_0x240;
  uVar7 = *(undefined8 *)&this->field_0x248;
  *(undefined8 *)&this->field_0x240 = *(undefined8 *)&this->field_0x250;
  *(undefined8 *)&this->field_0x248 = *(undefined8 *)&this->field_0x258;
  *(undefined8 *)&this->field_0x250 = uVar6;
  *(undefined8 *)&this->field_0x258 = uVar7;
  auVar1 = *(undefined1 (*) [16])this->m_srf_scale;
  auVar4._8_4_ = auVar1._0_4_;
  auVar4._0_8_ = auVar1._8_8_;
  auVar4._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])this->m_srf_scale = auVar4;
  uVar2 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
  pOVar3 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
  uVar9 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 * 0x10 != uVar9; uVar9 = uVar9 + 0x10) {
    auVar1 = *(undefined1 (*) [16])((long)&pOVar3->x + uVar9);
    auVar5._8_4_ = auVar1._0_4_;
    auVar5._0_8_ = auVar1._8_8_;
    auVar5._12_4_ = auVar1._4_4_;
    *(undefined1 (*) [16])((long)&pOVar3->x + uVar9) = auVar5;
  }
  return true;
}

Assistant:

bool ON_Mesh::TransposeSurfaceParameters()
{
	// swap m_srf_domain 
	ON_Interval temp = m_srf_domain[0];
	m_srf_domain[0]  = m_srf_domain[1];
	m_srf_domain[1]  = temp;

	double t = m_srf_scale[0];
	m_srf_scale[0] = m_srf_scale[1];
  m_srf_scale[1] = t;

  int S_count = m_S.Count();
  ON_2dPoint* S_array = m_S.Array();
  for (int i = 0; i < S_count; i++ )
  {
    ON_2dPoint& S = S_array[i];
    t = S.x; S.x = S.y; S.y = t;
  }
  return true;
}